

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.hpp
# Opt level: O0

void __thiscall ycqian::thread_pool::~thread_pool(thread_pool *this)

{
  bool bVar1;
  element_type *peVar2;
  lock_guard<std::mutex> local_18;
  lock_guard<std::mutex> lg;
  thread_pool *this_local;
  
  lg._M_device = (mutex_type *)this;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)this);
  if (bVar1) {
    peVar2 = std::
             __shared_ptr_access<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    std::lock_guard<std::mutex>::lock_guard(&local_18,&peVar2->mutex);
    peVar2 = std::
             __shared_ptr_access<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)this);
    peVar2->shutdown = true;
    std::lock_guard<std::mutex>::~lock_guard(&local_18);
    std::__shared_ptr_access<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<ycqian::thread_pool::data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)this);
    std::condition_variable::notify_all();
  }
  std::shared_ptr<ycqian::thread_pool::data>::~shared_ptr(&this->data_);
  return;
}

Assistant:

~thread_pool(){
            if (data_) {
                {
                    std::lock_guard<std::mutex> lg(data_->mutex);
                    data_->shutdown = true;
                }
                data_->cv.notify_all();
            }
        }